

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

XXH_errorcode XXH32_update(XXH32_state_t *state_in,void *input,size_t len)

{
  uint uVar1;
  BYTE *limit;
  ulong uVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar5 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar1 = state_in->total_len_32 + (int)len;
  state_in->total_len_32 = uVar1;
  state_in->large_len = state_in->large_len | (uint)(0xf < uVar1 || 0xf < len);
  uVar2 = (ulong)state_in->memsize;
  if (uVar2 + len < 0x10) {
    memcpy((void *)((long)state_in->mem32 + uVar2),input,len);
    uVar1 = state_in->memsize + (int)len;
  }
  else {
    pauVar3 = (undefined1 (*) [16])(len + (long)input);
    if (uVar2 != 0) {
      memcpy((void *)((long)state_in->mem32 + uVar2),input,(ulong)(0x10 - state_in->memsize));
      auVar4 = *(undefined1 (*) [16])state_in->mem32;
      iVar6 = auVar4._4_4_;
      auVar12._4_4_ = iVar6;
      auVar12._0_4_ = iVar6;
      auVar12._8_4_ = auVar4._12_4_;
      auVar12._12_4_ = auVar4._12_4_;
      uVar1 = auVar4._0_4_ * -0x7a143589 + state_in->v1;
      uVar7 = iVar6 * -0x7a143589 + state_in->v2;
      uVar8 = (int)((auVar4._8_8_ & 0xffffffff) * 0x85ebca77) + state_in->v3;
      uVar9 = (int)((auVar12._8_8_ & 0xffffffff) * 0x85ebca77) + state_in->v4;
      auVar4._0_4_ = uVar1 >> 0x13;
      auVar4._4_4_ = uVar7 >> 0x13;
      auVar4._8_4_ = uVar8 >> 0x13;
      auVar4._12_4_ = uVar9 >> 0x13;
      auVar5._0_4_ = uVar1 * 0x2000;
      auVar5._4_4_ = uVar7 * 0x2000;
      auVar5._8_4_ = uVar8 * 0x2000;
      auVar5._12_4_ = uVar9 * 0x2000;
      auVar5 = auVar5 | auVar4;
      iVar6 = auVar5._4_4_;
      auVar10._4_4_ = iVar6;
      auVar10._0_4_ = iVar6;
      auVar10._8_4_ = auVar5._12_4_;
      auVar10._12_4_ = auVar5._12_4_;
      state_in->v1 = auVar5._0_4_ * -0x61c8864f;
      state_in->v2 = iVar6 * -0x61c8864f;
      state_in->mem32[0] = (uint)((auVar5._8_8_ & 0xffffffff) * 0x9e3779b1);
      state_in->mem32[1] = (uint)((auVar10._8_8_ & 0xffffffff) * 0x9e3779b1);
      input = (void *)((long)input + (ulong)(0x10 - state_in->memsize));
      state_in->memsize = 0;
    }
    if (input <= pauVar3 + -1) {
      uVar1 = state_in->v1;
      uVar7 = state_in->v2;
      uVar8 = state_in->v3;
      uVar9 = state_in->v4;
      do {
        auVar4 = *input;
        uVar1 = auVar4._0_4_ * -0x7a143589 + uVar1;
        uVar7 = auVar4._4_4_ * -0x7a143589 + uVar7;
        uVar8 = (int)((auVar4._8_8_ & 0xffffffff) * 0x85ebca77) + uVar8;
        uVar9 = auVar4._12_4_ * -0x7a143589 + uVar9;
        auVar11._0_4_ = uVar1 >> 0x13;
        auVar11._4_4_ = uVar7 >> 0x13;
        auVar11._8_4_ = uVar8 >> 0x13;
        auVar11._12_4_ = uVar9 >> 0x13;
        auVar13._0_4_ = uVar1 * 0x2000;
        auVar13._4_4_ = uVar7 * 0x2000;
        auVar13._8_4_ = uVar8 * 0x2000;
        auVar13._12_4_ = uVar9 * 0x2000;
        auVar13 = auVar13 | auVar11;
        uVar1 = auVar13._0_4_ * -0x61c8864f;
        uVar8 = (uint)((auVar13._8_8_ & 0xffffffff) * 0x9e3779b1);
        uVar7 = auVar13._4_4_ * -0x61c8864f;
        uVar9 = auVar13._12_4_ * -0x61c8864f;
        input = (void *)((long)input + 0x10);
      } while (input <= pauVar3 + -1);
      state_in->v1 = uVar1;
      state_in->v2 = uVar7;
      state_in->v3 = uVar8;
      state_in->v4 = uVar9;
    }
    if (pauVar3 <= input) {
      return XXH_OK;
    }
    memcpy(state_in->mem32,input,(long)pauVar3 - (long)input);
    uVar1 = (uint)((long)pauVar3 - (long)input);
  }
  state_in->memsize = uVar1;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_update (XXH32_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH32_update_endian(state_in, input, len, XXH_bigEndian);
}